

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

ImGuiID __thiscall ImGuiWindow::GetIDNoKeepAlive(ImGuiWindow *this,void *ptr)

{
  uint uVar1;
  long lVar2;
  void *ptr_local;
  
  ptr_local = ptr;
  uVar1 = ~(this->IDStack).Data[(long)(this->IDStack).Size + -1];
  lVar2 = 0;
  do {
    uVar1 = uVar1 >> 8 ^ GCrc32LookupTable[(uint)*(byte *)((long)&ptr_local + lVar2) ^ uVar1 & 0xff]
    ;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 8);
  return ~uVar1;
}

Assistant:

ImGuiID ImGuiWindow::GetIDNoKeepAlive(const void* ptr)
{
    ImGuiID seed = IDStack.back();
    ImGuiID id = ImHashData(&ptr, sizeof(void*), seed);
#ifdef IMGUI_ENABLE_TEST_ENGINE
    ImGuiContext& g = *GImGui;
    IMGUI_TEST_ENGINE_ID_INFO(id, ImGuiDataType_Pointer, ptr);
#endif
    return id;
}